

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O0

int __thiscall ser::OffsetTable::AddNewSavepoint(OffsetTable *this,Savepoint *savepoint,int sid)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  ulong uVar4;
  size_type sVar5;
  ostream *poVar6;
  SerializationException *pSVar7;
  mapped_type *pmVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
  local_448;
  string local_410;
  undefined1 local_3f0 [8];
  SerializationException exception_1;
  ostringstream local_3a8 [8];
  ostringstream msg_1;
  string local_230;
  undefined1 local_210 [8];
  SerializationException exception;
  ostringstream local_1b8 [8];
  ostringstream msg;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_> local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_> local_28;
  const_iterator iter;
  int sid_local;
  Savepoint *savepoint_local;
  OffsetTable *this_local;
  
  iter._M_node._4_4_ = sid;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<ser::Savepoint,_int,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
       ::find(&this->savepointIndex_,savepoint);
  std::_Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_>::_Rb_tree_const_iterator
            (&local_28,&local_30);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<ser::Savepoint,_int,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
       ::end(&this->savepointIndex_);
  std::_Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_>::_Rb_tree_const_iterator
            (&local_38,&local_40);
  bVar2 = std::operator!=(&local_28,&local_38);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar6 = std::operator<<((ostream *)local_1b8,"Error: savepoint ");
    Savepoint::ToString_abi_cxx11_((string *)((long)&exception.message_.field_2 + 8),savepoint);
    poVar6 = std::operator<<(poVar6,(string *)(exception.message_.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6," is already registered in table ");
    poVar6 = std::operator<<(poVar6,"at position ");
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_>::operator->
                       (&local_28);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,ppVar3->second);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string((string *)(exception.message_.field_2._M_local_buf + 8));
    SerializationException::SerializationException((SerializationException *)local_210);
    std::__cxx11::ostringstream::str();
    SerializationException::Init((SerializationException *)local_210,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    pSVar7 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar7,(SerializationException *)local_210);
    __cxa_throw(pSVar7,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  if (-1 < (int)iter._M_node._4_4_) {
    uVar4 = (ulong)iter._M_node._4_4_;
    sVar5 = std::
            vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
            ::size(&this->entries_);
    if (uVar4 != sVar5) {
      std::__cxx11::ostringstream::ostringstream(local_3a8);
      poVar6 = std::operator<<((ostream *)local_3a8,"Error: requested ID ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iter._M_node._4_4_);
      poVar6 = std::operator<<(poVar6," for savepoint ");
      Savepoint::ToString_abi_cxx11_((string *)((long)&exception_1.message_.field_2 + 8),savepoint);
      poVar6 = std::operator<<(poVar6,(string *)(exception_1.message_.field_2._M_local_buf + 8));
      poVar6 = std::operator<<(poVar6,", but");
      poVar6 = std::operator<<(poVar6," it would be registered with ID ");
      sVar5 = std::
              vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
              ::size(&this->entries_);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar5);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)(exception_1.message_.field_2._M_local_buf + 8));
      SerializationException::SerializationException((SerializationException *)local_3f0);
      std::__cxx11::ostringstream::str();
      SerializationException::Init((SerializationException *)local_3f0,&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      pSVar7 = (SerializationException *)__cxa_allocate_exception(0x28);
      SerializationException::SerializationException(pSVar7,(SerializationException *)local_3f0);
      __cxa_throw(pSVar7,&SerializationException::typeinfo,
                  SerializationException::~SerializationException);
    }
  }
  sVar5 = std::
          vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
          ::size(&this->entries_);
  iter._M_node._4_4_ = (uint)sVar5;
  std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::push_back
            (&this->savepoints_,savepoint);
  local_448._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_448._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_448._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_448._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_448._M_t._M_impl._0_8_ = 0;
  local_448._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_448._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
  ::map(&local_448);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ::push_back(&this->entries_,&local_448);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
  ::~map(&local_448);
  iVar1 = iter._M_node._4_4_;
  pmVar8 = std::
           map<ser::Savepoint,_int,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
           ::operator[](&this->savepointIndex_,savepoint);
  *pmVar8 = iVar1;
  return iter._M_node._4_4_;
}

Assistant:

int OffsetTable::AddNewSavepoint(const Savepoint& savepoint, int sid)
{
    // Check that savepoint does not exist by looking at the index
    std::map<Savepoint, int>::const_iterator iter = savepointIndex_.find(savepoint);

    if (iter != savepointIndex_.end())
    {
        std::ostringstream msg;
        msg << "Error: savepoint " << savepoint.ToString() << " is already registered in table "
            << "at position " << iter->second << "\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Check requested ID
    if (sid >= 0 && static_cast<unsigned>(sid) != entries_.size())
    {
        std::ostringstream msg;
        msg << "Error: requested ID " << sid << " for savepoint " << savepoint.ToString() << ", but"
            << " it would be registered with ID " << entries_.size() << "\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Register savepoint
    sid = entries_.size();
    savepoints_.push_back(savepoint);
    entries_.push_back(OffsetTableEntry());
    savepointIndex_[savepoint] = sid;
    return sid;
}